

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

writer * argo::operator<<(writer *w,double d)

{
  ostream *this;
  void *this_00;
  string local_1c8 [52];
  int local_194;
  ostringstream local_190 [8];
  ostringstream ss;
  double d_local;
  writer *w_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = (int)std::setprecision(0x11);
  this = std::operator<<((ostream *)local_190,(_Setprecision)local_194);
  this_00 = (void *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(this_00,d);
  std::__cxx11::ostringstream::str();
  (*w->_vptr_writer[2])(w,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return w;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, double d)
{
    ostringstream ss;
    ss << setprecision(17) << fixed << d;
    w.write(ss.str());
    return w;
}